

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void __thiscall gimage::View::setImage(View *this,ImageU8 *img)

{
  Camera *this_00;
  long lVar1;
  long h;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *unaff_retaddr;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=(unaff_retaddr,in_RDI);
  if (*(long *)(in_RDI + 2) != 0) {
    lVar1 = gmath::Camera::getWidth(*(Camera **)(in_RDI + 2));
    if (lVar1 == 0) {
      lVar1 = gmath::Camera::getHeight(*(Camera **)(in_RDI + 2));
      if (lVar1 == 0) {
        this_00 = *(Camera **)(in_RDI + 2);
        lVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI);
        h = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI);
        gmath::Camera::setSize(this_00,lVar1,h);
      }
    }
  }
  return;
}

Assistant:

void View::setImage(const ImageU8 &img)
{
  image=img;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(image.getWidth(), image.getHeight());
  }
}